

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_leadership_takeover
          (raft_server *this,req_msg *req,ptr<custom_notification_msg> *msg,ptr<resp_msg> *resp)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  srv_role sVar4;
  element_type *peVar5;
  msg_base *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long in_RSI;
  element_type *in_RDI;
  ptr<resp_msg> pVar7;
  raft_server *in_stack_00000010;
  raft_server *in_stack_ffffffffffffff48;
  shared_ptr<nuraft::resp_msg> *in_stack_ffffffffffffff50;
  shared_ptr<nuraft::resp_msg> local_78 [3];
  string local_48 [48];
  msg_base *local_18;
  
  local_18 = in_RDX;
  bVar1 = is_leader(in_stack_ffffffffffffff48);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d73d7);
      iVar3 = (*peVar5->_vptr_logger[7])();
      if (1 < iVar3) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d73fa);
        uVar2 = msg_base::get_src(local_18);
        msg_if_given_abi_cxx11_
                  ((char *)local_48,
                   "got leadership takeover request from peer %d, I\'m already a leader",
                   (ulong)uVar2);
        (*peVar5->_vptr_logger[8])
                  (peVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_leadership_takeover",0xd9,local_48);
        std::__cxx11::string::~string(local_48);
      }
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              (in_stack_ffffffffffffff50,(shared_ptr<nuraft::resp_msg> *)in_stack_ffffffffffffff48);
    _Var6._M_pi = extraout_RDX;
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1d74bc);
      iVar3 = (*peVar5->_vptr_logger[7])();
      if (3 < iVar3) {
        in_stack_ffffffffffffff48 =
             (raft_server *)
             std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d74df);
        in_stack_ffffffffffffff50 = local_78;
        msg_if_given_abi_cxx11_
                  ((char *)in_stack_ffffffffffffff50,"[LEADERSHIP TAKEOVER] got request");
        (*in_stack_ffffffffffffff48->_vptr_raft_server[8])
                  (in_stack_ffffffffffffff48,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_custom_notification.cxx"
                   ,"handle_leadership_takeover",0xdc,in_stack_ffffffffffffff50);
        std::__cxx11::string::~string((string *)local_78);
      }
    }
    initiate_vote(this,req._7_1_);
    sVar4 = std::atomic::operator_cast_to_srv_role((atomic<nuraft::srv_role> *)0x1d756e);
    if (sVar4 != leader) {
      restart_election_timer(in_stack_00000010);
    }
    std::shared_ptr<nuraft::resp_msg>::shared_ptr
              (in_stack_ffffffffffffff50,(shared_ptr<nuraft::resp_msg> *)in_stack_ffffffffffffff48);
    _Var6._M_pi = extraout_RDX_00;
  }
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leadership_takeover
                           ( req_msg& req,
                             ptr<custom_notification_msg> msg,
                             ptr<resp_msg> resp )
{
    if (is_leader()) {
        p_er("got leadership takeover request from peer %d, "
             "I'm already a leader", req.get_src());
        return resp;
    }
    p_in("[LEADERSHIP TAKEOVER] got request");

    // Initiate force vote (ignoring priority).
    initiate_vote(true);

    // restart the election timer if this is not yet a leader
    if (role_ != srv_role::leader) {
        restart_election_timer();
    }

    return resp;
}